

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixAccess(sqlite3_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  undefined1 local_c0 [8];
  stat buf;
  int amode;
  int *pResOut_local;
  int flags_local;
  char *zPath_local;
  sqlite3_vfs *NotUsed_local;
  
  buf.__glibc_reserved[2]._4_4_ = 0;
  if (flags == 0) {
    buf.__glibc_reserved[2]._4_4_ = 0;
  }
  else if (flags == 1) {
    buf.__glibc_reserved[2]._4_4_ = 6;
  }
  else if (flags == 2) {
    buf.__glibc_reserved[2]._4_4_ = 4;
  }
  iVar1 = (*aSyscall[2].pCurrent)(zPath,(ulong)buf.__glibc_reserved[2]._4_4_);
  *pResOut = (uint)(iVar1 == 0);
  if ((((flags == 0) && (*pResOut != 0)) &&
      (iVar1 = (*aSyscall[4].pCurrent)(zPath,local_c0), iVar1 == 0)) && (buf.st_rdev == 0)) {
    *pResOut = 0;
  }
  return 0;
}

Assistant:

static int unixAccess(
  sqlite3_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  int amode = 0;
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError( return SQLITE_IOERR_ACCESS; );
  switch( flags ){
    case SQLITE_ACCESS_EXISTS:
      amode = F_OK;
      break;
    case SQLITE_ACCESS_READWRITE:
      amode = W_OK|R_OK;
      break;
    case SQLITE_ACCESS_READ:
      amode = R_OK;
      break;

    default:
      assert(!"Invalid flags argument");
  }
  *pResOut = (osAccess(zPath, amode)==0);
  if( flags==SQLITE_ACCESS_EXISTS && *pResOut ){
    struct stat buf;
    if( 0==osStat(zPath, &buf) && buf.st_size==0 ){
      *pResOut = 0;
    }
  }
  return SQLITE_OK;
}